

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  arm64_shifter aVar2;
  uint8_t *buffer;
  uchar *str;
  cs_detail *pcVar3;
  size_t count;
  cs_err cVar4;
  char *pcVar5;
  long lVar6;
  size_t len;
  ulong uVar7;
  size_t len_00;
  char *pcVar8;
  char *__format;
  ulong uVar9;
  size_t sVar10;
  cs_insn *insn;
  cs_insn *local_48;
  long local_40;
  size_t local_38;
  
  lVar6 = 0;
  do {
    local_40 = lVar6;
    cVar4 = cs_open((&DAT_00265280)[lVar6 * 10],(&DAT_00265284)[lVar6 * 10],&handle);
    if (cVar4 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      if ((long)(int)(&DAT_002652a0)[lVar6 * 10] != 0) {
        cs_option(handle,CS_OPT_SYNTAX,(long)(int)(&DAT_002652a0)[lVar6 * 10]);
      }
      buffer = (&PTR_anon_var_dwarf_27_00265288)[lVar6 * 5];
      str = (uchar *)(&DAT_00265290)[lVar6 * 5];
      local_38 = cs_disasm(handle,buffer,(size_t)str,0x1000,0,&local_48);
      if (local_38 == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00265298)[lVar6 * 5]);
        print_string_hex((char *)buffer,str,len_00);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00265298)[lVar6 * 5]);
        print_string_hex((char *)buffer,str,len);
        puts("Disasm:");
        sVar10 = 0;
        do {
          printf("0x%lx:\t%s\t%s\n",local_48[sVar10].address,local_48[sVar10].mnemonic,
                 local_48[sVar10].op_str);
          pcVar3 = local_48[sVar10].detail;
          if (pcVar3 != (cs_detail *)0x0) {
            if ((pcVar3->field_6).arm.op_count != '\0') {
              printf("\top_count: %u\n");
            }
            if ((pcVar3->field_6).arm.op_count != '\0') {
              pcVar8 = (char *)((long)&pcVar3->field_6 + 0x48);
              uVar9 = 0;
              do {
                switch(*(undefined4 *)(pcVar8 + -0x14)) {
                case 1:
                  pcVar5 = cs_reg_name(handle,*(uint *)(pcVar8 + -0x10));
                  __format = "\t\toperands[%u].type: REG = %s\n";
LAB_001434a7:
                  printf(__format,uVar9 & 0xffffffff,pcVar5);
                  break;
                case 2:
                  uVar7 = (ulong)*(uint *)(pcVar8 + -0x10);
                  pcVar5 = "\t\toperands[%u].type: IMM = 0x%x\n";
                  goto LAB_001434ea;
                case 3:
                  printf("\t\toperands[%u].type: MEM\n",uVar9 & 0xffffffff);
                  if (*(uint *)(pcVar8 + -0x10) != 0) {
                    pcVar5 = cs_reg_name(handle,*(uint *)(pcVar8 + -0x10));
                    printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar9 & 0xffffffff,pcVar5);
                  }
                  if (*(uint *)(pcVar8 + -0xc) != 0) {
                    pcVar5 = cs_reg_name(handle,*(uint *)(pcVar8 + -0xc));
                    printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar9 & 0xffffffff,pcVar5);
                  }
                  if (*(int *)(pcVar8 + -8) != 1) {
                    printf("\t\t\toperands[%u].mem.scale: %u\n",uVar9 & 0xffffffff);
                  }
                  uVar7 = (ulong)*(uint *)(pcVar8 + -4);
                  if (*(uint *)(pcVar8 + -4) != 0) {
                    pcVar5 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
                    goto LAB_001434ea;
                  }
                  break;
                case 4:
                  printf("\t\toperands[%u].type: FP = %f\n",*(undefined8 *)(pcVar8 + -0x10),
                         uVar9 & 0xffffffff);
                  break;
                default:
                  switch(*(undefined4 *)(pcVar8 + -0x14)) {
                  case 0x40:
                    uVar7 = (ulong)*(uint *)(pcVar8 + -0x10);
                    pcVar5 = "\t\toperands[%u].type: C-IMM = %u\n";
                    break;
                  case 0x41:
                    uVar7 = (ulong)*(uint *)(pcVar8 + -0x10);
                    pcVar5 = "\t\toperands[%u].type: P-IMM = %u\n";
                    break;
                  case 0x42:
                    pcVar5 = "le";
                    if (*(int *)(pcVar8 + -0x10) == 1) {
                      pcVar5 = "be";
                    }
                    __format = "\t\toperands[%u].type: SETEND = %s\n";
                    goto LAB_001434a7;
                  case 0x43:
                    uVar7 = (ulong)*(uint *)(pcVar8 + -0x10);
                    pcVar5 = "\t\toperands[%u].type: SYSREG = %u\n";
                    break;
                  default:
                    goto switchD_001433c3_default;
                  }
LAB_001434ea:
                  printf(pcVar5,uVar9 & 0xffffffff,uVar7);
                }
switchD_001433c3_default:
                uVar1 = *(uint *)(pcVar8 + -0x1c);
                if ((uVar1 != 0) && (*(uint *)(pcVar8 + -0x18) != 0)) {
                  if (uVar1 < 6) {
                    printf("\t\t\tShift: %u = %u\n",(ulong)uVar1);
                  }
                  else {
                    pcVar5 = cs_reg_name(handle,*(uint *)(pcVar8 + -0x18));
                    printf("\t\t\tShift: %u = %s\n",(ulong)uVar1,pcVar5);
                  }
                }
                if (*(int *)(pcVar8 + -0x20) != -1) {
                  printf("\t\toperands[%u].vector_index = %u\n",uVar9 & 0xffffffff);
                }
                if (*pcVar8 == '\x01') {
                  puts("\t\tSubtracted: True");
                }
                uVar9 = uVar9 + 1;
                pcVar8 = pcVar8 + 0x28;
              } while (uVar9 < (pcVar3->field_6).arm.op_count);
            }
            aVar2 = (pcVar3->field_6).arm64.operands[0].shift.type;
            if ((aVar2 != ARM64_SFT_INVALID) && (aVar2 != 0xf)) {
              printf("\tCode condition: %u\n");
            }
            if ((pcVar3->field_6).arm.update_flags == true) {
              puts("\tUpdate-flags: True");
            }
            if ((pcVar3->field_6).arm.writeback == true) {
              puts("\tWrite-back: True");
            }
            if ((pcVar3->field_6).x86.disp != 0) {
              printf("\tCPSI-mode: %u\n");
            }
            if ((pcVar3->field_6).x86.sib_index != X86_REG_INVALID) {
              printf("\tCPSI-flag: %u\n");
            }
            if ((pcVar3->field_6).arm64.operands[0].vector_index != 0) {
              printf("\tVector-data: %u\n");
            }
            if ((pcVar3->field_6).arm.vector_size != 0) {
              printf("\tVector-size: %u\n");
            }
            if ((pcVar3->field_6).x86.prefix[0] == '\x01') {
              puts("\tUser-mode: True");
            }
            if ((pcVar3->field_6).x86.sse_cc != X86_SSE_CC_INVALID) {
              printf("\tMemory-barrier: %u\n");
            }
            putchar(10);
          }
          count = local_38;
          sVar10 = sVar10 + 1;
        } while (sVar10 != local_38);
        printf("0x%lx:\n",(ulong)local_48[local_38 - 1].size + local_48[local_38 - 1].address);
        cs_free(local_48,count);
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
    }
    lVar6 = local_40 + 1;
    if (lVar6 == 6) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}